

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModulationType.cpp
# Opt level: O0

bool __thiscall DIS::ModulationType::operator==(ModulationType *this,ModulationType *rhs)

{
  bool local_19;
  bool ivarsEqual;
  ModulationType *rhs_local;
  ModulationType *this_local;
  
  local_19 = this->_major == rhs->_major && this->_spreadSpectrum == rhs->_spreadSpectrum;
  if (this->_detail != rhs->_detail) {
    local_19 = false;
  }
  if (this->_system != rhs->_system) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool ModulationType::operator ==(const ModulationType& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_spreadSpectrum == rhs._spreadSpectrum) ) ivarsEqual = false;
     if( ! (_major == rhs._major) ) ivarsEqual = false;
     if( ! (_detail == rhs._detail) ) ivarsEqual = false;
     if( ! (_system == rhs._system) ) ivarsEqual = false;

    return ivarsEqual;
 }